

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserUtils.cpp
# Opt level: O2

unsigned_short
GeneratedSaxParser::Utils::toInteger<unsigned_short,false>(ParserChar *buffer,bool *failed)

{
  byte bVar1;
  unsigned_short uVar2;
  int iVar3;
  bool bVar4;
  ulong uVar5;
  ParserChar *s;
  byte *pbVar6;
  bool bVar7;
  
  bVar4 = true;
  if ((buffer != (ParserChar *)0x0) && (bVar1 = *buffer, bVar1 != 0)) {
    pbVar6 = (byte *)(buffer + 1);
    do {
      uVar5 = (ulong)bVar1;
      if ((0x20 < bVar1) || ((0x100002600U >> (uVar5 & 0x3f) & 1) == 0)) {
        iVar3 = 0;
        bVar7 = false;
        goto LAB_00842bc0;
      }
      bVar1 = *pbVar6;
      pbVar6 = pbVar6 + 1;
    } while (bVar1 != 0);
  }
  uVar2 = 0;
LAB_00842bb8:
  *failed = bVar4;
  return uVar2;
LAB_00842bc0:
  if ((char)uVar5 == '\0') goto LAB_00842be1;
  if (9 < (byte)((char)uVar5 - 0x30U)) {
    bVar4 = (bool)(~bVar7 & 1);
    uVar2 = 0;
    if (bVar7) {
      uVar2 = (unsigned_short)iVar3;
    }
    goto LAB_00842bb8;
  }
  iVar3 = iVar3 * 10 + (int)uVar5 + -0x30;
  uVar5 = (ulong)*pbVar6;
  pbVar6 = pbVar6 + 1;
  bVar7 = true;
  goto LAB_00842bc0;
LAB_00842be1:
  bVar4 = false;
  uVar2 = (unsigned_short)iVar3;
  goto LAB_00842bb8;
}

Assistant:

IntegerType Utils::toInteger(const ParserChar* buffer, bool& failed)
	{
		const ParserChar* s = buffer;
		if ( !s )
		{
			failed = true;
			return 0;
		}

		if ( *s == '\0' )
		{
			failed = true;
			return 0;
		}

		// Skip leading white spaces
		while ( isWhiteSpace(*s) )
		{
			++s;
			if ( *s == '\0' )
			{
				failed = true;
				return 0;
			}
		}

		IntegerType value = 0;
		IntegerType sign = 1;
		if ( signedInteger )
		{
			if (*s == '-')
			{
				++s;
				sign = -1;
			}
			else if (*s == '+')
			{
				++s;
			}
		}

		bool digitFound = false;
		while (true)
		{
			if ( *s == '\0' )
			{
				failed = false;
				return value * sign;
			}

			if ( isdigit(*s) )
			{
				value = value * 10 + (*s - '0');
				digitFound = true;
			}
			else
			{
				break;
			}
			++s;
		}
		if ( digitFound )
		{
			failed = false;
			if ( signedInteger )
				return value * sign;
			else
				return value;
		}
		else
		{
			failed = true;
			return 0;
		}
	}